

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::UnicodeString::doAppend
          (UnicodeString *this,UChar *srcChars,int32_t srcStart,int32_t srcLength)

{
  UChar *s;
  ushort uVar1;
  char16_t *pcVar2;
  UBool UVar3;
  char16_t *pcVar4;
  int iVar5;
  int32_t iVar6;
  int newCapacity;
  char16_t *pcVar7;
  bool bVar8;
  UnicodeString copy;
  UnicodeString local_70;
  
  if ((((srcChars != (UChar *)0x0) && (srcLength != 0)) &&
      (((this->fUnion).fStackFields.fLengthAndFlags & 0x11U) == 0)) &&
     ((s = srcChars + srcStart, -1 < srcLength || (srcLength = u_strlen_63(s), srcLength != 0)))) {
    uVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
    if ((short)uVar1 < 0) {
      iVar6 = (this->fUnion).fFields.fLength;
    }
    else {
      iVar6 = (int)(short)uVar1 >> 5;
    }
    pcVar7 = (this->fUnion).fStackFields.fBuffer;
    pcVar2 = (this->fUnion).fFields.fArray;
    pcVar4 = pcVar7;
    if (((int)(short)uVar1 & 2U) == 0) {
      pcVar4 = pcVar2;
    }
    if ((uVar1 & 0x19) == 0) {
      bVar8 = true;
      if ((uVar1 & 4) != 0) {
        bVar8 = *(int *)(pcVar2 + -2) == 1;
      }
    }
    else {
      bVar8 = false;
    }
    if (((bVar8) && (pcVar4 < s + srcLength)) && (s < pcVar4 + iVar6)) {
      UnicodeString(&local_70,s,srcLength);
      if ((local_70.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
        if ((local_70.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
          local_70.fUnion.fFields.fArray = local_70.fUnion.fStackFields.fBuffer;
        }
        this = doAppend(this,local_70.fUnion.fFields.fArray,0,srcLength);
      }
      else {
        setToBogus(this);
      }
      ~UnicodeString(&local_70);
    }
    else {
      newCapacity = iVar6 + srcLength;
      uVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
      iVar5 = 0x1b;
      if ((uVar1 & 2) == 0) {
        iVar5 = (this->fUnion).fFields.fCapacity;
      }
      if (((iVar5 < newCapacity) || ((uVar1 & 0x19) != 0)) ||
         (((uVar1 & 4) != 0 && (*(int *)((this->fUnion).fFields.fArray + -2) != 1)))) {
        iVar5 = (newCapacity >> 2) + 0x80 + newCapacity;
        if (0x7ffffff5 - newCapacity < (newCapacity >> 2) + 0x80) {
          iVar5 = 0x7ffffff5;
        }
        UVar3 = cloneArrayIfNeeded(this,newCapacity,iVar5,'\x01',(int32_t **)0x0,'\0');
        if (UVar3 == '\0') {
          return this;
        }
      }
      if ((undefined1  [56])((undefined1  [56])this->fUnion & (undefined1  [56])0x2) ==
          (undefined1  [56])0x0) {
        pcVar7 = (this->fUnion).fFields.fArray;
      }
      if ((0 < srcLength) && (s != pcVar7 + iVar6)) {
        memmove(pcVar7 + iVar6,s,(ulong)(uint)(srcLength * 2));
      }
      uVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
      if (newCapacity < 0x400) {
        (this->fUnion).fStackFields.fLengthAndFlags = (short)newCapacity * 0x20 | uVar1 & 0x1f;
      }
      else {
        (this->fUnion).fStackFields.fLengthAndFlags = uVar1 | 0xffe0;
        (this->fUnion).fFields.fLength = newCapacity;
      }
    }
  }
  return this;
}

Assistant:

UnicodeString&
UnicodeString::doAppend(const UChar *srcChars, int32_t srcStart, int32_t srcLength) {
  if(!isWritable() || srcLength == 0 || srcChars == NULL) {
    return *this;
  }

  // Perform all remaining operations relative to srcChars + srcStart.
  // From this point forward, do not use srcStart.
  srcChars += srcStart;

  if(srcLength < 0) {
    // get the srcLength if necessary
    if((srcLength = u_strlen(srcChars)) == 0) {
      return *this;
    }
  }

  int32_t oldLength = length();
  int32_t newLength = oldLength + srcLength;

  // Check for append onto ourself
  const UChar* oldArray = getArrayStart();
  if (isBufferWritable() &&
      oldArray < srcChars + srcLength &&
      srcChars < oldArray + oldLength) {
    // Copy into a new UnicodeString and start over
    UnicodeString copy(srcChars, srcLength);
    if (copy.isBogus()) {
      setToBogus();
      return *this;
    }
    return doAppend(copy.getArrayStart(), 0, srcLength);
  }

  // optimize append() onto a large-enough, owned string
  if((newLength <= getCapacity() && isBufferWritable()) ||
      cloneArrayIfNeeded(newLength, getGrowCapacity(newLength))) {
    UChar *newArray = getArrayStart();
    // Do not copy characters when
    //   UChar *buffer=str.getAppendBuffer(...);
    // is followed by
    //   str.append(buffer, length);
    // or
    //   str.appendString(buffer, length)
    // or similar.
    if(srcChars != newArray + oldLength) {
      us_arrayCopy(srcChars, 0, newArray, oldLength, srcLength);
    }
    setLength(newLength);
  }
  return *this;
}